

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

type_info * pybind11::detail::get_type_info(type_info *tp,bool throw_if_missing)

{
  internals *this;
  iterator iVar1;
  type_info *ptVar2;
  string tname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  this = get_internals();
  local_50._M_dataplus._M_p = (pointer)tp;
  iVar1 = std::
          _Hashtable<std::type_index,_std::pair<const_std::type_index,_void_*>,_std::allocator<std::pair<const_std::type_index,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<std::type_index,_std::pair<const_std::type_index,_void_*>,_std::allocator<std::pair<const_std::type_index,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,(key_type *)&local_50);
  if (iVar1.super__Node_iterator_base<std::pair<const_std::type_index,_void_*>,_false>._M_cur ==
      (__node_type *)0x0) {
    if (throw_if_missing) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,*(char **)(tp + 8) + (**(char **)(tp + 8) == '*'),
                 (allocator<char> *)&local_70);
      clean_type_id(&local_50);
      std::operator+(&local_30,"pybind11::detail::get_type_info: unable to find type info for \"",
                     &local_50);
      std::operator+(&local_70,&local_30,"\"");
      pybind11_fail(&local_70);
    }
    ptVar2 = (type_info *)0x0;
  }
  else {
    ptVar2 = *(type_info **)
              ((long)iVar1.
                     super__Node_iterator_base<std::pair<const_std::type_index,_void_*>,_false>.
                     _M_cur + 0x10);
  }
  return ptVar2;
}

Assistant:

PYBIND11_NOINLINE inline detail::type_info *get_type_info(const std::type_info &tp,
                                                          bool throw_if_missing = false) {
    auto &types = get_internals().registered_types_cpp;

    auto it = types.find(std::type_index(tp));
    if (it != types.end())
        return (detail::type_info *) it->second;
    if (throw_if_missing) {
        std::string tname = tp.name();
        detail::clean_type_id(tname);
        pybind11_fail("pybind11::detail::get_type_info: unable to find type info for \"" + tname + "\"");
    }
    return nullptr;
}